

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

bool __thiscall wirehair::Codec::OpportunisticPeeling(Codec *this,uint16_t row_i,uint32_t row_seed)

{
  long lVar1;
  PeelRowParameters *this_00;
  anon_union_2_3_10dc256e_for_PeelColumn_1 *paVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  PeelRow *pPVar6;
  uint uVar7;
  short *psVar8;
  short sVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  undefined6 in_register_00000032;
  ulong uVar13;
  short sVar14;
  bool bVar15;
  uint16_t unmarked [2];
  ushort local_54 [2];
  PeelRow *local_50;
  ulong local_48;
  int local_40;
  uint local_3c;
  Codec *local_38;
  
  pPVar6 = this->_peel_rows;
  uVar10 = CONCAT62(in_register_00000032,row_i) & 0xffffffff;
  local_50 = pPVar6 + uVar10;
  local_50->RecoveryId = row_seed;
  this_00 = &pPVar6[uVar10].Params;
  PeelRowParameters::Initialize(this_00,row_seed,this->_p_seed,this->_block_count,this->_mix_count);
  local_3c = (uint)this->_block_count;
  uVar3 = this->_block_next_prime;
  uVar10 = (ulong)this_00->PeelFirst;
  uVar4 = this_00->PeelAdd;
  uVar12 = (uint)uVar4;
  local_40 = uVar12 << 0x10;
  local_48 = 0;
  local_38 = this;
  sVar14 = this_00->PeelCount - 1;
  do {
    uVar13 = uVar10 & 0xffff;
    lVar1 = (ulong)(uint)((int)uVar13 << 6) + uVar13 * 2;
    uVar5 = *(ushort *)((long)local_38->_peel_col_refs->Rows + lVar1 + -2);
    if ((ulong)uVar5 < 0x20) {
      psVar8 = (short *)((long)local_38->_peel_col_refs->Rows + lVar1 + -2);
      *psVar8 = uVar5 + 1;
      psVar8[(ulong)uVar5 + 1] = row_i;
      if (local_38->_peel_cols[uVar13].Mark == '\0') {
        local_54[(uint)local_48 & 1] = (uint16_t)uVar10;
        local_48 = (ulong)((uint)local_48 + 1);
      }
    }
    else {
      FixPeelFailure(local_38,local_50,(uint16_t)uVar10);
    }
    if (0x1f < uVar5) goto LAB_00103d2d;
    sVar9 = sVar14;
    if (sVar14 != 0) {
      sVar9 = sVar14 + -1;
      uVar10 = (ulong)((int)uVar13 + (uint)uVar4) % (ulong)(uint)uVar3;
      if (local_3c <= (uint)uVar10) {
        uVar7 = (uint)uVar3 - (uint)uVar10;
        uVar11 = uVar7 & 0xffff;
        if (uVar4 < (ushort)uVar7) {
          uVar10 = (ulong)(local_40 - uVar11) % (ulong)uVar12;
        }
        else {
          uVar10 = (ulong)(uVar12 - uVar11);
        }
      }
    }
    bVar15 = sVar14 != 0;
    sVar14 = sVar9;
  } while (bVar15);
  local_50->UnmarkedCount = (uint16_t)local_48;
  if ((uint16_t)local_48 == 2) {
    (local_50->Marks).Unmarked[0] = local_54[0];
    (local_50->Marks).Unmarked[1] = local_54[1];
    paVar2 = &local_38->_peel_cols[local_54[0]].field_1;
    paVar2->Weight2Refs = paVar2->Weight2Refs + 1;
    paVar2 = &local_38->_peel_cols[local_54[1]].field_1;
    paVar2->Weight2Refs = paVar2->Weight2Refs + 1;
  }
  else if (((uint)local_48 & 0xffff) == 1) {
    SolveWithPeel(local_38,local_50,row_i,local_54[0]);
  }
  else if ((local_48 & 0xffff) == 0) {
    local_50->NextRow = local_38->_defer_head_rows;
    local_38->_defer_head_rows = row_i;
  }
LAB_00103d2d:
  return uVar5 < 0x20;
}

Assistant:

bool Codec::OpportunisticPeeling(
    const uint16_t row_i, ///< Row index
    const uint32_t row_seed ///< Row PRNG seed
)
{
    PeelRow *row = &_peel_rows[row_i];

    row->RecoveryId = row_seed;

    row->Params.Initialize(row_seed, _p_seed, _block_count, _mix_count);

    CAT_IF_DUMP(cout << "Row " << row_seed << " in slot " << row_i << " of weight "
        << row->Params.PeelCount << " [a=" << row->Params.PeelAdd << "] : ";)

    PeelRowIterator iter(row->Params, _block_count, _block_next_prime);

    uint16_t unmarked_count = 0;
    uint16_t unmarked[2];

    // Iterate columns in peeling matrix
    do
    {
        const uint16_t column_i = iter.GetColumn();

        CAT_IF_DUMP(cout << column_i << " ";)

        PeelRefs *refs = &_peel_col_refs[column_i];

        // If there was not enough room in the reference list:
        if (refs->RowCount >= CAT_REF_LIST_MAX)
        {
            CAT_IF_DUMP(cout << "OpportunisticPeeling: Failure!  " \
                "Ran out of space for row references.  CAT_REF_LIST_MAX must be increased!" << endl;)

            CAT_DEBUG_BREAK();

            FixPeelFailure(row, column_i);

            return false;
        }

        // Add row reference to column
        refs->Rows[refs->RowCount++] = row_i;

        // If column is unmarked:
        if (_peel_cols[column_i].Mark == MARK_TODO) {
            unmarked[unmarked_count++ & 1] = column_i;
        }
    } while (iter.Iterate());

    CAT_IF_DUMP(cout << endl;)

    // Initialize row state
    row->UnmarkedCount = unmarked_count;

    switch (unmarked_count)
    {
    case 0:
        // Link at head of defer list
        row->NextRow = _defer_head_rows;
        _defer_head_rows = row_i;
        break;

    case 1:
        // Solve only unmarked column with this row
        SolveWithPeel(
            row,
            row_i,
            unmarked[0]);
        break;

    case 2:
        // Remember which two columns were unmarked
        row->Marks.Unmarked[0] = unmarked[0];
        row->Marks.Unmarked[1] = unmarked[1];

        // Increment weight-2 reference count for unmarked columns
        _peel_cols[unmarked[0]].Weight2Refs++;
        _peel_cols[unmarked[1]].Weight2Refs++;
        break;
    }

    return true;
}